

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

char * promptsep(char *buf,int num_post_attribs)

{
  size_t sVar1;
  
  if ((1 < num_post_attribs) && (post_attribs < num_post_attribs && 1 < post_attribs)) {
    sVar1 = strlen(buf);
    (buf + sVar1)[0] = ',';
    (buf + sVar1)[1] = '\0';
  }
  sVar1 = strlen(buf);
  (buf + sVar1)[0] = ' ';
  (buf + sVar1)[1] = '\0';
  post_attribs = post_attribs + -1;
  if (post_attribs == '\0' && 1 < num_post_attribs) {
    sVar1 = strlen(buf);
    builtin_strncpy(buf + sVar1,"and ",5);
  }
  return buf;
}

Assistant:

static char *promptsep(char *buf, int num_post_attribs)
{
	const char *conj = "and ";
	if (num_post_attribs > 1
	    && post_attribs < num_post_attribs && post_attribs > 1)
		strcat(buf, ",");
	strcat(buf, " ");
	--post_attribs;
	if (!post_attribs && num_post_attribs > 1) strcat(buf, conj);
	return buf;
}